

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O3

void __thiscall
wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>::combineInto
          (StructValuesMap<wasm::PossibleConstantValues> *this,
          StructValuesMap<wasm::PossibleConstantValues> *combinedInfos)

{
  _Hash_node_base *p_Var1;
  pointer pPVar2;
  bool bVar3;
  StructValues<wasm::PossibleConstantValues> *pSVar4;
  ulong uVar5;
  ulong uVar6;
  
  p_Var1 = (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
           )._M_h._M_before_begin._M_nxt;
  do {
    if (p_Var1 == (_Hash_node_base *)0x0) {
      return;
    }
    if (p_Var1[3]._M_nxt != p_Var1[2]._M_nxt) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        pSVar4 = operator[](combinedInfos,(HeapType)p_Var1[1]._M_nxt);
        pPVar2 = (pSVar4->
                 super_vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                 ).
                 super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pSVar4->
                          super_vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                          ).
                          super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 5) <= uVar5)
        {
          __assert_fail("index < this->size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/struct-utils.h"
                        ,0x22,
                        "T &wasm::StructUtils::StructValues<wasm::PossibleConstantValues>::operator[](size_t) [T = wasm::PossibleConstantValues]"
                       );
        }
        if ((ulong)((long)p_Var1[3]._M_nxt - (long)p_Var1[2]._M_nxt >> 5) <= uVar5) {
          __assert_fail("index < this->size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/struct-utils.h"
                        ,0x27,
                        "const T &wasm::StructUtils::StructValues<wasm::PossibleConstantValues>::operator[](size_t) const [T = wasm::PossibleConstantValues]"
                       );
        }
        PossibleConstantValues::combine
                  (pPVar2 + uVar5,(PossibleConstantValues *)(p_Var1[2]._M_nxt + uVar5 * 4));
        bVar3 = uVar6 < (ulong)((long)p_Var1[3]._M_nxt - (long)p_Var1[2]._M_nxt >> 5);
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar3);
    }
    p_Var1 = p_Var1->_M_nxt;
  } while( true );
}

Assistant:

void combineInto(StructValuesMap<T>& combinedInfos) const {
    for (auto& [type, info] : *this) {
      for (Index i = 0; i < info.size(); i++) {
        combinedInfos[type][i].combine(info[i]);
      }
    }
  }